

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_t * matd_op_recurse(char *expr,int *pos,matd_t *acc,matd_t **args,int *argpos,matd_t **garb,
                        int *garbpos,int oneterm)

{
  int iVar1;
  matd_t *a;
  matd_t acc_00;
  matd_t *pmVar2;
  char *start;
  matd_t mVar3;
  char *end;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffac;
  int oneterm_00;
  int local_38 [2];
  
  pmVar2 = (matd_t *)0x0;
LAB_003fbf1e:
  a = pmVar2;
  iVar1 = *pos;
  oneterm_00 = (int)acc;
  switch(expr[iVar1]) {
  case ' ':
    *pos = iVar1 + 1;
    pmVar2 = a;
    goto LAB_003fbf1e;
  case '!':
  case '\"':
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
  case ',':
  case '/':
  case ':':
  case ';':
  case '<':
  case '=':
  case '>':
  case '?':
  case '@':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'G':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
    goto switchD_003fbf44_caseD_21;
  case '(':
    if (((int)garbpos != 0) && (a != (matd_t *)0x0)) {
      return a;
    }
    *pos = iVar1 + 1;
    uVar4 = 0;
    goto LAB_003fc108;
  case ')':
    goto switchD_003fbf44_caseD_29;
  case '*':
    *pos = iVar1 + 1;
    uVar4 = 1;
LAB_003fc108:
    acc_00 = (matd_t)matd_op_recurse(expr,pos,acc,args,argpos,garb,
                                     (int *)CONCAT44(in_stack_ffffffffffffffac,uVar4),oneterm_00);
LAB_003fbf9b:
    pmVar2 = matd_op_gobble_right(expr,pos,(matd_t *)acc_00,(matd_t **)argpos,(int *)garb);
    if (a == (matd_t *)0x0) goto LAB_003fbf1e;
    pmVar2 = matd_multiply(a,pmVar2);
    break;
  case '+':
    if (((int)garbpos != 0) && (a != (matd_t *)0x0)) {
      return a;
    }
    if (a == (matd_t *)0x0) {
      __assert_fail("acc != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                    ,0x2e0,
                    "matd_t *matd_op_recurse(const char *, int *, matd_t *, matd_t **, int *, matd_t **, int *, int)"
                   );
    }
    *pos = iVar1 + 1;
    pmVar2 = matd_op_recurse(expr,pos,acc,args,argpos,garb,
                             (int *)CONCAT44(in_stack_ffffffffffffffac,1),oneterm_00);
    pmVar2 = matd_op_gobble_right(expr,pos,pmVar2,(matd_t **)argpos,(int *)garb);
    pmVar2 = matd_add(a,pmVar2);
    break;
  case '-':
    if (((int)garbpos != 0) && (a != (matd_t *)0x0)) {
      return a;
    }
    *pos = iVar1 + 1;
    pmVar2 = matd_op_recurse(expr,pos,acc,args,argpos,garb,
                             (int *)CONCAT44(in_stack_ffffffffffffffac,1),oneterm_00);
    pmVar2 = matd_op_gobble_right(expr,pos,pmVar2,(matd_t **)argpos,(int *)garb);
    if (a == (matd_t *)0x0) {
      pmVar2 = matd_scale(pmVar2,-1.0);
    }
    else {
      pmVar2 = matd_subtract(a,pmVar2);
    }
    break;
  case '.':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    mVar3 = (matd_t)strtod(expr + iVar1,(char **)local_38);
    *pos = *pos + (local_38[0] - (int)(expr + iVar1));
    acc_00 = (matd_t)calloc(1,0x10);
    *(matd_t *)acc_00 = (matd_t)0x0;
    *(matd_t *)((long)acc_00 + 8) = mVar3;
    iVar1 = *(int *)garb;
    *(matd_t *)(argpos + (long)iVar1 * 2) = acc_00;
    *(int *)garb = iVar1 + 1;
    goto LAB_003fbf9b;
  case 'F':
    acc_00 = acc[*(int *)args];
    iVar1 = *(int *)garb;
    *(matd_t *)(argpos + (long)iVar1 * 2) = acc_00;
    *(int *)garb = iVar1 + 1;
    *pos = *pos + 1;
    goto LAB_003fc004;
  case 'M':
    acc_00 = acc[*(int *)args];
    *pos = iVar1 + 1;
LAB_003fc004:
    *(int *)args = *(int *)args + 1;
    goto LAB_003fbf9b;
  default:
    if (expr[iVar1] == '\0') {
      return a;
    }
    goto switchD_003fbf44_caseD_21;
  }
  iVar1 = *(int *)garb;
  *(matd_t **)(argpos + (long)iVar1 * 2) = pmVar2;
  *(int *)garb = iVar1 + 1;
  goto LAB_003fbf1e;
switchD_003fbf44_caseD_21:
  matd_op_recurse_cold_1();
switchD_003fbf44_caseD_29:
  if ((int)garbpos == 0) {
    *pos = iVar1 + 1;
  }
  return a;
}

Assistant:

static matd_t *matd_op_recurse(const char *expr, int *pos, matd_t *acc, matd_t **args, int *argpos,
                               matd_t **garb, int *garbpos, int oneterm)
{
    while (expr[*pos] != 0) {

        switch (expr[*pos]) {

            case '(': {
                if (oneterm && acc != NULL)
                    return acc;
                (*pos)++;
                matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 0);
                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

            case ')': {
                if (oneterm)
                    return acc;

                (*pos)++;
                return acc;
            }

            case '*': {
                (*pos)++;

                matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 1);
                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

            case 'F': {
                matd_t *rhs = args[*argpos];
                garb[*garbpos] = rhs;
                (*garbpos)++;

                (*pos)++;
                (*argpos)++;

                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

            case 'M': {
                matd_t *rhs = args[*argpos];

                (*pos)++;
                (*argpos)++;

                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

/*
  case 'D': {
  int rows = expr[*pos+1]-'0';
  int cols = expr[*pos+2]-'0';

  matd_t *rhs = matd_create(rows, cols);

  break;
  }
*/
                // a constant (SCALAR) defined inline. Treat just like M, creating a matd_t on the fly.
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            case '.': {
                const char *start = &expr[*pos];
                char *end;
                double s = strtod(start, &end);
                (*pos) += (end - start);
                matd_t *rhs = matd_create_scalar(s);
                garb[*garbpos] = rhs;
                (*garbpos)++;

                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

            case '+': {
                if (oneterm && acc != NULL)
                    return acc;

                // don't support unary plus
                assert(acc != NULL);
                (*pos)++;
                matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 1);
                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                matd_t *res = matd_add(acc, rhs);

                garb[*garbpos] = res;
                (*garbpos)++;
                acc = res;
                break;
            }

            case '-': {
                if (oneterm && acc != NULL)
                    return acc;

                if (acc == NULL) {
                    // unary minus
                    (*pos)++;
                    matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 1);
                    rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                    matd_t *res = matd_scale(rhs, -1);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                } else {
                    // subtract
                    (*pos)++;
                    matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 1);
                    rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                    matd_t *res = matd_subtract(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }
                break;
            }

            case ' ': {
                // nothing to do. spaces are meaningless.
                (*pos)++;
                break;
            }

            default: {
                fprintf(stderr, "matd_op(): Unknown character: '%c'\n", expr[*pos]);
                assert(expr[*pos] != expr[*pos]);
            }
        }
    }
    return acc;
}